

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dct.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  string *this;
  long lVar7;
  char *__s;
  int dct_length;
  vector<double,_std::allocator<double>_> output_y;
  vector<double,_std::allocator<double>_> output_x;
  DiscreteCosineTransform discrete_cosine_transform;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> input_y;
  vector<double,_std::allocator<double>_> input_x;
  Buffer buffer;
  ifstream ifs;
  int local_4c4;
  uint local_4c0;
  int local_4bc;
  string local_4b8;
  vector<double,_std::allocator<double>_> local_498;
  vector<double,_std::allocator<double>_> local_480;
  DiscreteCosineTransform local_468;
  string local_418 [3];
  ios_base local_3a8 [264];
  vector<double,_std::allocator<double>_> local_2a0;
  vector<double,_std::allocator<double>_> local_288;
  Buffer local_270;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_4c4 = 0x100;
  local_4c0 = 1;
  local_4bc = 1;
LAB_0010378c:
  while (iVar4 = ya_getopt_long(argc,argv,"l:q:o:h",(option *)0x0,(int *)0x0), iVar4 == 0x6c) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_418);
    bVar1 = sptk::ConvertStringToInteger(&local_238,&local_4c4);
    bVar2 = local_4c4 < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -l option must be a positive integer",
                 0x39);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dct","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
LAB_00103b6e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418[0]._M_dataplus._M_p != &local_418[0].field_2) {
        operator_delete(local_418[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
  }
  if (iVar4 < 0x6f) {
    if (iVar4 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Too many input files",0x14);
        local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dct","");
        sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
        goto LAB_00103b6e;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar2 = sptk::SetBinaryMode();
      this = &local_238;
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Cannot set translation mode",0x1b);
        local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dct","");
        sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
        goto LAB_00103b6e;
      }
      std::ifstream::ifstream(this);
      if ((__s != (char *)0x0) &&
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_418,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_418,__s,sVar5);
        local_468._vptr_DiscreteCosineTransform = (_func_int **)&local_468.fourier_transform_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"dct","");
        sptk::PrintErrorMessage((string *)&local_468,(ostringstream *)local_418);
        if ((FourierTransform *)local_468._vptr_DiscreteCosineTransform !=
            &local_468.fourier_transform_) {
          operator_delete(local_468._vptr_DiscreteCosineTransform);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
        std::ios_base::~ios_base(local_3a8);
        iVar4 = 1;
        goto LAB_001041da;
      }
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        this = (string *)&std::cin;
      }
      sptk::DiscreteCosineTransform::DiscreteCosineTransform(&local_468,local_4c4);
      local_270._vptr_Buffer = (_func_int **)&PTR__Buffer_00112b48;
      local_270.fourier_transform_real_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_270.fourier_transform_real_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.fourier_transform_real_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_270.fourier_transform_imag_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_270.fourier_transform_imag_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_270.fourier_transform_imag_part_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar4 = (*(local_468.fourier_transform_.fourier_transform_)->_vptr_FourierTransformInterface
                [3])();
      if ((char)iVar4 != '\0') {
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_288,(long)local_4c4,(allocator_type *)local_418);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_2a0,(long)local_4c4,(allocator_type *)local_418);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_480,(long)local_4c4,(allocator_type *)local_418);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_498,(long)local_4c4,(allocator_type *)local_418);
        iVar4 = 0;
        goto LAB_00103ca5;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_418,"Failed to initialize DiscreteCosineTransform",0x2c);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"dct","");
      sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
      std::ios_base::~ios_base(local_3a8);
      iVar4 = 1;
      goto LAB_001041c3;
    }
    if (iVar4 == 0x68) {
      anon_unknown.dwarf_2fc9::PrintUsage((ostream *)&std::cout);
      return 0;
    }
  }
  else {
    if (iVar4 == 0x6f) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_418);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_468);
      if (bVar2) {
        bVar2 = sptk::IsInRange((uint)local_468._vptr_DiscreteCosineTransform,0,4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar2) {
          local_4c0 = (uint)local_468._vptr_DiscreteCosineTransform;
          goto LAB_0010378c;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the range of ",0x10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
      std::ostream::operator<<((ostream *)poVar6,4);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dct","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
      goto LAB_00103b6e;
    }
    if (iVar4 == 0x71) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_418);
      bVar2 = sptk::ConvertStringToInteger(&local_238,(int *)&local_468);
      if (bVar2) {
        bVar2 = sptk::IsInRange((uint)local_468._vptr_DiscreteCosineTransform,0,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar2) {
          local_4bc = (uint)local_468._vptr_DiscreteCosineTransform;
          goto LAB_0010378c;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the range of ",0x10);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," to ",4);
      std::ostream::operator<<((ostream *)poVar6,1);
      local_418[0]._M_dataplus._M_p = (pointer)&local_418[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"dct","");
      sptk::PrintErrorMessage(local_418,(ostringstream *)&local_238);
      goto LAB_00103b6e;
    }
  }
  anon_unknown.dwarf_2fc9::PrintUsage((ostream *)&std::cerr);
  return 1;
LAB_00103ca5:
  do {
    bVar2 = sptk::ReadStream<double>(true,0,0,local_4c4,&local_288,(istream *)this,(int *)0x0);
    if ((!bVar2) ||
       ((local_4bc == 0 &&
        (bVar2 = sptk::ReadStream<double>(true,0,0,local_4c4,&local_2a0,(istream *)this,(int *)0x0),
        !bVar2)))) goto LAB_00104181;
    bVar2 = sptk::DiscreteCosineTransform::Run
                      (&local_468,&local_288,&local_2a0,&local_480,&local_498,&local_270);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_418,"Failed to run discrete cosine transform",0x27);
      local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"dct","");
      sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_418);
      goto LAB_0010414b;
    }
    if (local_4c0 < 2) {
LAB_00103dbf:
      bVar2 = sptk::WriteStream<double>(0,local_4c4,&local_480,(ostream *)&std::cout,(int *)0x0);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_418,"Failed to write output sequence",0x1f);
        local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"dct","");
        sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_418);
        goto LAB_0010414b;
      }
    }
    else {
      if (local_4c0 == 3) {
        if (0 < (long)local_4c4) {
          lVar7 = 0;
          do {
            local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7] =
                 SQRT(local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7] *
                      local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7] +
                      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7] *
                      local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7]);
            lVar7 = lVar7 + 1;
          } while (local_4c4 != lVar7);
LAB_00103db5:
          if ((4 < local_4c0) || (local_4c0 == 2)) goto LAB_00103de3;
        }
        goto LAB_00103dbf;
      }
      if (local_4c0 == 4) {
        if (0 < (long)local_4c4) {
          lVar7 = 0;
          do {
            local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7] =
                 local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7] *
                 local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7] +
                 local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7] *
                 local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
            lVar7 = lVar7 + 1;
          } while (local_4c4 != lVar7);
          goto LAB_00103db5;
        }
        goto LAB_00103dbf;
      }
    }
LAB_00103de3:
  } while (((local_4c0 & 0xfffffffd) != 0) ||
          (bVar2 = sptk::WriteStream<double>
                             (0,local_4c4,&local_498,(ostream *)&std::cout,(int *)0x0), bVar2));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_418);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_418,"Failed to write imaginary parts",0x1f);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"dct","");
  sptk::PrintErrorMessage(&local_4b8,(ostringstream *)local_418);
LAB_0010414b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_418);
  std::ios_base::~ios_base(local_3a8);
  iVar4 = 1;
LAB_00104181:
  if (local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_498.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_480.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_001041c3:
  sptk::DiscreteCosineTransform::Buffer::~Buffer(&local_270);
  sptk::DiscreteCosineTransform::~DiscreteCosineTransform(&local_468);
LAB_001041da:
  std::ifstream::~ifstream(&local_238);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  int dct_length(kDefaultDctLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &dct_length) ||
            dct_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("dct", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::DiscreteCosineTransform discrete_cosine_transform(dct_length);
  sptk::DiscreteCosineTransform::Buffer buffer;
  if (!discrete_cosine_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize DiscreteCosineTransform";
    sptk::PrintErrorMessage("dct", error_message);
    return 1;
  }

  std::vector<double> input_x(dct_length);
  std::vector<double> input_y(dct_length);
  std::vector<double> output_x(dct_length);
  std::vector<double> output_y(dct_length);

  while (
      sptk::ReadStream(true, 0, 0, dct_length, &input_x, &input_stream, NULL)) {
    if (kInputRealAndImagParts == input_format &&
        !sptk::ReadStream(true, 0, 0, dct_length, &input_y, &input_stream,
                          NULL)) {
      break;
    }

    if (!discrete_cosine_transform.Run(input_x, input_y, &output_x, &output_y,
                                       &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to run discrete cosine transform";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }

    if (kOutputAmplitude == output_format) {
      for (int i(0); i < dct_length; ++i) {
        output_x[i] =
            std::sqrt(output_x[i] * output_x[i] + output_y[i] * output_y[i]);
      }
    } else if (kOutputPower == output_format) {
      for (int i(0); i < dct_length; ++i) {
        output_x[i] = output_x[i] * output_x[i] + output_y[i] * output_y[i];
      }
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputRealPart == output_format ||
         kOutputAmplitude == output_format || kOutputPower == output_format) &&
        !sptk::WriteStream(0, dct_length, output_x, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write output sequence";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputImagPart == output_format) &&
        !sptk::WriteStream(0, dct_length, output_y, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write imaginary parts";
      sptk::PrintErrorMessage("dct", error_message);
      return 1;
    }
  }

  return 0;
}